

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(ArrayFeatureType *this)

{
  if (((this->_oneof_case_[0] == 0x1f) || (this->_oneof_case_[0] == 0x15)) &&
     ((this->ShapeFlexibility_).enumeratedshapes_ != (ArrayFeatureType_EnumeratedShapes *)0x0)) {
    (*(((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void ArrayFeatureType::clear_ShapeFlexibility() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.ArrayFeatureType)
  switch (ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      delete ShapeFlexibility_.enumeratedshapes_;
      break;
    }
    case kShapeRange: {
      delete ShapeFlexibility_.shaperange_;
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = SHAPEFLEXIBILITY_NOT_SET;
}